

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O1

ssize_t buffer_find(Buffer *buffer,size_t start,void *_data,size_t len)

{
  byte bVar1;
  uint8 *puVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  uint8 *__s;
  uint8 *__s1;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long unaff_RBX;
  ulong uVar9;
  void *__s2;
  BufferBlock *pBVar10;
  ulong __n;
  BufferBlock *pBVar11;
  int local_80;
  
  if (len == 0) {
    unaff_RBX = 0;
  }
  else if (buffer->total_bytes - start < len || buffer->total_bytes <= start) {
LAB_00126353:
    unaff_RBX = -1;
  }
  else {
    pBVar10 = buffer->head;
    if (start == 0) {
      __s = pBVar10->data;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      while (uVar8 = pBVar10->bytes + uVar7, uVar8 <= start) {
        pBVar10 = pBVar10->next;
        uVar7 = uVar8;
        if (pBVar10 == (BufferBlock *)0x0) {
          __assert_fail("item != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                        ,0x3d4,
                        "ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)");
        }
      }
      __s = pBVar10->data + (start - uVar7);
    }
    if (__s == (uint8 *)0x0) {
      __assert_fail("ptr != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x3e2,"ssize_t buffer_find(Buffer *, const size_t, const void *, const size_t)"
                   );
    }
    bVar1 = *_data;
    do {
      if (pBVar10 == (BufferBlock *)0x0) goto LAB_00126353;
      puVar2 = pBVar10->data;
      sVar3 = pBVar10->bytes;
      __s = (uint8 *)memchr(__s,(uint)bVar1,(size_t)(puVar2 + (sVar3 - (long)__s)));
      do {
        __s1 = __s;
        if (__s1 == (uint8 *)0x0) {
          uVar7 = sVar3 + uVar7;
          pBVar10 = pBVar10->next;
          if (pBVar10 == (BufferBlock *)0x0) {
            __s = (uint8 *)0x0;
          }
          else {
            __s = pBVar10->data;
          }
          break;
        }
        lVar6 = (long)__s1 - (long)puVar2;
        if (len == 1) {
LAB_0012650f:
          bVar4 = false;
          __s = __s1;
          unaff_RBX = lVar6 + uVar7;
        }
        else {
          uVar8 = sVar3 - lVar6;
          if (len <= sVar3 - lVar6) {
            uVar8 = len;
          }
          if ((sVar3 - lVar6 == 0) || (iVar5 = bcmp(__s1,_data,uVar8), iVar5 == 0)) {
            uVar9 = len - uVar8;
            if (uVar9 != 0) {
              __s2 = (void *)(uVar8 + (long)_data);
              pBVar11 = pBVar10->next;
              do {
                if (pBVar11 == (BufferBlock *)0x0) {
                  local_80 = 0;
                  break;
                }
                uVar8 = pBVar11->bytes;
                __n = uVar8;
                if (uVar9 < uVar8) {
                  __n = uVar9;
                }
                iVar5 = bcmp(pBVar11->data,__s2,__n);
                bVar4 = false;
                if (iVar5 == 0) {
                  if (uVar8 < uVar9) {
                    uVar9 = uVar9 - __n;
                    __s2 = (void *)((long)__s2 + __n);
                    pBVar11 = pBVar11->next;
                    bVar4 = true;
                  }
                  else {
                    local_80 = 1;
                    bVar4 = false;
                  }
                }
                else {
                  local_80 = 0;
                }
              } while (bVar4);
              if (local_80 == 0) goto LAB_00126517;
            }
            goto LAB_0012650f;
          }
LAB_00126517:
          __s = (uint8 *)memchr(__s1 + 1,(uint)bVar1,(sVar3 - lVar6) - 1);
          bVar4 = true;
        }
      } while (bVar4);
    } while (__s1 == (uint8 *)0x0);
  }
  return unaff_RBX;
}

Assistant:

ssize_t buffer_find(Buffer *buffer, const size_t start,
                    const void *_data, const size_t len)
{
    if (len == 0)
        return 0;  // I guess that's right.

    if (start >= buffer->total_bytes)
        return -1;  // definitely can't match.

    if (len > (buffer->total_bytes - start))
        return -1;  // definitely can't match.

    // Find the start point somewhere in the center of a buffer.
    BufferBlock *item = buffer->head;
    const uint8 *ptr = item->data;
    size_t pos = 0;
    if (start > 0)
    {
        while (1)
        {
            assert(item != NULL);
            if ((pos + item->bytes) > start)  // start is in this block.
            {
                ptr = item->data + (start - pos);
                break;
            } // if

            pos += item->bytes;
            item = item->next;
        } // while
    } // if

    // okay, we're at the origin of the search.
    assert(item != NULL);
    assert(ptr != NULL);

    const uint8 *data = (const uint8 *) _data;
    const uint8 first = *data;
    while (item != NULL)
    {
        const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
        ptr = (uint8 *) memchr(ptr, first, itemremain);
        while (ptr != NULL)
        {
            const size_t retval = pos + ((size_t) (ptr - item->data));
            if (len == 1)
                return retval;  // we're done, here it is!

            const size_t itemremain = item->bytes - ((size_t)(ptr-item->data));
            const size_t avail = len < itemremain ? len : itemremain;
            if ((avail == 0) || (memcmp(ptr, data, avail) == 0))
            {
                // okay, we've got a (sub)string match! Move to the next block.
                // check all blocks until we get a complete match or a failure.
                if (blockscmp(item->next, data+avail, len-avail))
                    return (ssize_t) retval;
            } // if

            // try again, further in this block.
            ptr = (uint8 *) memchr(ptr + 1, first, itemremain - 1);
        } // while

        pos += item->bytes;
        item = item->next;
        if (item != NULL)
            ptr = item->data;
    } // while

    return -1;  // no match found.
}